

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O3

void Convert16To8Plane(uint16_t *src_y,int src_stride_y,uint8_t *dst_y,int dst_stride_y,int scale,
                      int width,int height)

{
  int iVar1;
  uint uVar2;
  code *pcVar3;
  code *pcVar4;
  
  iVar1 = height;
  if (height < 0) {
    iVar1 = -height;
    dst_y = dst_y + ~height * dst_stride_y;
    dst_stride_y = -dst_stride_y;
  }
  if (dst_stride_y == width && src_stride_y == width) {
    width = iVar1 * src_stride_y;
    src_stride_y = 0;
    dst_stride_y = 0;
    iVar1 = 1;
  }
  uVar2 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar2 = InitCpuFlags();
  }
  if ((width & 0xfU) == 0) {
    pcVar3 = Convert16To8Row_SSSE3;
  }
  else {
    pcVar3 = Convert16To8Row_Any_SSSE3;
  }
  if ((uVar2 & 0x40) == 0) {
    pcVar3 = Convert16To8Row_C;
  }
  uVar2 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar2 = InitCpuFlags();
  }
  if ((width & 0x1fU) == 0) {
    pcVar4 = Convert16To8Row_AVX2;
  }
  else {
    pcVar4 = Convert16To8Row_Any_AVX2;
  }
  if ((uVar2 >> 10 & 1) == 0) {
    pcVar4 = pcVar3;
  }
  if (iVar1 != 0) {
    do {
      (*pcVar4)(src_y,dst_y,scale,width);
      dst_y = dst_y + dst_stride_y;
      src_y = src_y + src_stride_y;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

LIBYUV_API
void Convert16To8Plane(const uint16_t* src_y,
                       int src_stride_y,
                       uint8_t* dst_y,
                       int dst_stride_y,
                       int scale,  // 16384 for 10 bits
                       int width,
                       int height) {
  int y;
  void (*Convert16To8Row)(const uint16_t* src_y, uint8_t* dst_y, int scale,
                          int width) = Convert16To8Row_C;

  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_y = dst_y + (height - 1) * dst_stride_y;
    dst_stride_y = -dst_stride_y;
  }
  // Coalesce rows.
  if (src_stride_y == width && dst_stride_y == width) {
    width *= height;
    height = 1;
    src_stride_y = dst_stride_y = 0;
  }
#if defined(HAS_CONVERT16TO8ROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    Convert16To8Row = Convert16To8Row_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      Convert16To8Row = Convert16To8Row_SSSE3;
    }
  }
#endif
#if defined(HAS_CONVERT16TO8ROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    Convert16To8Row = Convert16To8Row_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      Convert16To8Row = Convert16To8Row_AVX2;
    }
  }
#endif

  // Convert plane
  for (y = 0; y < height; ++y) {
    Convert16To8Row(src_y, dst_y, scale, width);
    src_y += src_stride_y;
    dst_y += dst_stride_y;
  }
}